

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::mergefacets(tetgenmesh *this)

{
  memorypool *pmVar1;
  void **ppvVar2;
  shellface ppdVar3;
  long lVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  arraypool *this_00;
  ulong *puVar7;
  char *pcVar8;
  void *pvVar9;
  badface *pbVar10;
  long lVar11;
  ulong *puVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  tetgenmesh *this_01;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  shellface *pppdVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double n2 [3];
  double n1 [3];
  double local_98 [4];
  double local_78 [4];
  point local_58;
  ulong local_48;
  tetgenmesh *local_40;
  point local_38;
  
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 8;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  dVar24 = cos((this->b->facet_separate_ang_tol / 180.0) * PI);
  pmVar1 = this->subsegs;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  while (puVar7 = (ulong *)memorypool::traverse(pmVar1), puVar7 != (ulong *)0x0) {
    if (puVar7[3] != 0) {
      lVar16 = 0;
      do {
        while (lVar11 = (long)this->shmarkindex, *(int *)((long)puVar7 + lVar11 * 4) != -1) {
          pmVar1 = this->subsegs;
          do {
            puVar7 = (ulong *)memorypool::traverse(pmVar1);
            if (puVar7 == (ulong *)0x0) goto LAB_001303b4;
          } while (puVar7[3] == 0);
        }
        pppdVar23 = (shellface *)(*puVar7 & 0xfffffffffffffff8);
        if (pppdVar23 != (shellface *)0x0) {
          uVar18 = (uint)*puVar7;
          uVar14 = uVar18 & 7;
          uVar15 = (ulong)(uVar14 >> 1);
          ppdVar3 = pppdVar23[uVar15];
          uVar19 = (ulong)ppdVar3 & 0xfffffffffffffff8;
          if (uVar19 != 0) {
            uVar20 = (ulong)((uint)((ulong)ppdVar3 >> 1) & 3);
            if (((shellface *)(*(ulong *)(uVar19 + uVar20 * 8) & 0xfffffffffffffff8) == pppdVar23)
               && (*(int *)((long)pppdVar23 + lVar11 * 4) == *(int *)(uVar19 + lVar11 * 4))) {
              local_38 = (point)puVar7[sorgpivot[0]];
              this_01 = (tetgenmesh *)puVar7[sdestpivot[0]];
              uVar18 = uVar18 & 7;
              local_58 = *(point *)(uVar19 + (long)sapexpivot[(uint)ppdVar3 & 7] * 8);
              local_48 = uVar15;
              local_40 = this_01;
              facenormal(this_01,local_38,(point)this_01,(point)pppdVar23[sapexpivot[uVar18]],
                         local_78,1,(double *)0x0);
              facenormal(this_01,local_38,(point)local_40,local_58,local_98,1,(double *)0x0);
              auVar25._0_8_ = local_78[0] * local_78[0] + local_78[1] * local_78[1];
              auVar25._8_8_ = local_98[0] * local_98[0] + local_98[1] * local_98[1];
              auVar27._8_8_ = local_98[2] * local_98[2] + auVar25._8_8_;
              auVar27._0_8_ = local_78[2] * local_78[2] + auVar25._0_8_;
              auVar27 = sqrtpd(auVar25,auVar27);
              dVar29 = (local_78[2] * local_98[2] +
                       local_78[0] * local_98[0] + local_78[1] * local_98[1]) /
                       (auVar27._8_8_ * auVar27._0_8_);
              if (dVar24 <= dVar29) {
                pcVar8 = arraypool::getblock(this_00,(int)lVar16);
                lVar11 = (long)this_00->objectbytes *
                         ((long)this_00->objectsperblock - 1U & this_00->objects);
                lVar16 = this_00->objects + 1;
                this_00->objects = lVar16;
                *(double *)(pcVar8 + lVar11) = dVar29;
                puVar7[6] = (ulong)(pcVar8 + lVar11);
              }
              else {
                pppdVar23[local_48 + 6] = (shellface)0x0;
                *(undefined8 *)(uVar19 + 0x30 + uVar20 * 8) = 0;
                pmVar1 = this->subsegs;
                puVar7[3] = 0;
                *puVar7 = (ulong)pmVar1->deaditemstack;
                pmVar1->deaditemstack = puVar7;
                pmVar1->items = pmVar1->items + -1;
                pbVar10 = (badface *)memorypool::alloc(this->flippool);
                (pbVar10->ss).sh = pppdVar23;
                (pbVar10->ss).shver = uVar14;
                uVar15 = (ulong)(uVar18 << 2);
                pbVar10->forg = (point)pppdVar23[*(int *)((long)sorgpivot + uVar15)];
                pbVar10->fdest = (point)pppdVar23[*(int *)((long)sdestpivot + uVar15)];
                pbVar10->nextitem = this->flipstack;
                this->flipstack = pbVar10;
              }
            }
          }
        }
        pmVar1 = this->subsegs;
        do {
          puVar7 = (ulong *)memorypool::traverse(pmVar1);
          if (puVar7 == (ulong *)0x0) goto LAB_001303b4;
        } while (puVar7[3] == 0);
      } while( true );
    }
  }
LAB_001303b4:
  dVar24 = cos((this->b->facet_small_ang_tol / 180.0) * PI);
  local_58 = (point)cos(((this->b->facet_separate_ang_tol + -5.0) / 180.0) * PI);
  pmVar1 = this->subfaces;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  do {
    pvVar9 = memorypool::traverse(pmVar1);
    if (pvVar9 == (void *)0x0) {
LAB_001306f0:
      arraypool::~arraypool(this_00);
      operator_delete(this_00,0x30);
      if (this->flipstack == (badface *)0x0) {
        return;
      }
      lawsonflip(this);
      return;
    }
  } while (*(long *)((long)pvVar9 + 0x18) == 0);
  iVar22 = 0;
  do {
    iVar13 = 0;
    iVar21 = iVar22;
    do {
      uVar15 = *(ulong *)((long)pvVar9 + (long)(iVar21 >> 1) * 8 + 0x30);
      iVar22 = snextpivot[iVar21];
      if ((uVar15 != 0) &&
         (uVar19 = *(ulong *)((long)pvVar9 + (long)(iVar22 >> 1) * 8 + 0x30), uVar19 != 0)) {
        lVar16 = *(long *)((long)pvVar9 + (long)sorgpivot[iVar21] * 8);
        lVar11 = *(long *)((long)pvVar9 + (long)sdestpivot[iVar21] * 8);
        lVar4 = *(long *)((long)pvVar9 + (long)sapexpivot[iVar21] * 8);
        lVar17 = 0;
        do {
          local_78[lVar17] = *(double *)(lVar16 + lVar17 * 8) - *(double *)(lVar11 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        lVar16 = 0;
        do {
          local_98[lVar16] = *(double *)(lVar4 + lVar16 * 8) - *(double *)(lVar11 + lVar16 * 8);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        auVar26._0_8_ = local_78[0] * local_78[0] + local_78[1] * local_78[1];
        auVar26._8_8_ = local_98[0] * local_98[0] + local_98[1] * local_98[1];
        auVar6._8_8_ = local_98[2] * local_98[2] + auVar26._8_8_;
        auVar6._0_8_ = local_78[2] * local_78[2] + auVar26._0_8_;
        auVar27 = sqrtpd(auVar26,auVar6);
        if (dVar24 < (local_78[2] * local_98[2] +
                     local_78[0] * local_98[0] + local_78[1] * local_98[1]) /
                     (auVar27._8_8_ * auVar27._0_8_)) {
          puVar7 = (ulong *)(uVar15 & 0xfffffffffffffff8);
          pdVar5 = (double *)puVar7[6];
          dVar29 = 1.0;
          if (pdVar5 != (double *)0x0) {
            dVar29 = *pdVar5;
          }
          puVar12 = (ulong *)(uVar19 & 0xfffffffffffffff8);
          dVar28 = 1.0;
          if ((double *)puVar12[6] != (double *)0x0) {
            dVar28 = *(double *)puVar12[6];
          }
          if (dVar29 < (double)local_58) {
            if ((double)local_58 <= dVar28 || dVar29 < dVar28) {
              puVar12 = puVar7;
            }
          }
          else if ((double)local_58 <= dVar28) goto LAB_001305df;
          uVar18 = (uint)*puVar12 & 7;
          pppdVar23 = (shellface *)(*puVar12 & 0xfffffffffffffff8);
          uVar14 = uVar18 * 4;
          uVar15 = *(ulong *)((long)pppdVar23 + (ulong)(uVar14 & 0xfffffff8));
          *(undefined8 *)((long)pppdVar23 + (ulong)(uVar14 & 0xfffffff8) + 0x30) = 0;
          *(undefined8 *)((uVar15 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)uVar15 & 6) * 4) = 0;
          pmVar1 = this->subsegs;
          puVar12[3] = 0;
          *puVar12 = (ulong)pmVar1->deaditemstack;
          pmVar1->deaditemstack = puVar12;
          pmVar1->items = pmVar1->items + -1;
          pbVar10 = (badface *)memorypool::alloc(this->flippool);
          (pbVar10->ss).sh = pppdVar23;
          (pbVar10->ss).shver = uVar18;
          pbVar10->forg = (point)pppdVar23[*(int *)((long)sorgpivot + (ulong)uVar14)];
          pbVar10->fdest = (point)pppdVar23[*(int *)((long)sdestpivot + (ulong)uVar14)];
          pbVar10->nextitem = this->flipstack;
          this->flipstack = pbVar10;
          iVar22 = iVar21;
          break;
        }
      }
LAB_001305df:
      iVar13 = iVar13 + 1;
      iVar21 = iVar22;
    } while (iVar13 != 3);
    pmVar1 = this->subfaces;
    do {
      pvVar9 = memorypool::traverse(pmVar1);
      if (pvVar9 == (void *)0x0) goto LAB_001306f0;
    } while (*(long *)((long)pvVar9 + 0x18) == 0);
  } while( true );
}

Assistant:

void tetgenmesh::mergefacets()
{
  face parentsh, neighsh, neineish;
  face segloop;
  point pa, pb, pc, pd;
  REAL n1[3], n2[3];
  REAL cosang, cosang_tol;


  // Allocate an array to save calcaulated dihedral angles at segments.
  arraypool *dihedangarray = new arraypool(sizeof(double), 10);
  REAL *paryang = NULL;

  // First, remove coplanar segments.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_separate_ang_tol / 180.0 * PI);

  subsegs->traversalinit();
  segloop.sh = shellfacetraverse(subsegs);
  while (segloop.sh != (shellface *) NULL) {
    // Only remove a segment if it has a marker '-1'.
    if (shellmark(segloop) != -1) {
      segloop.sh = shellfacetraverse(subsegs);
      continue;
    }
    spivot(segloop, parentsh);
    if (parentsh.sh != NULL) {
      spivot(parentsh, neighsh);
      if (neighsh.sh != NULL) {
        spivot(neighsh, neineish);
        if (neineish.sh == parentsh.sh) {
          // Exactly two subfaces at this segment.
          // Only merge them if they have the same boundary marker.
          if (shellmark(parentsh) == shellmark(neighsh)) {
            pa = sorg(segloop);
            pb = sdest(segloop);
            pc = sapex(parentsh);
            pd = sapex(neighsh);
            // Calculate the dihedral angle at the segment [a,b].
            facenormal(pa, pb, pc, n1, 1, NULL);
            facenormal(pa, pb, pd, n2, 1, NULL);
            cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
            if (cosang < cosang_tol) {
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
            } else {
              // Save 'cosang' to avoid re-calculate it.
              // Re-use the pointer at the first segment.
              dihedangarray->newindex((void **) &paryang);
              *paryang = cosang;
              segloop.sh[6] = (shellface) paryang;
            }
          } 
        } // if (neineish.sh == parentsh.sh)
      }
    }
    segloop.sh = shellfacetraverse(subsegs);
  }

  // Second, remove ridge segments at small angles.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_small_ang_tol / 180.0 * PI);
  REAL cosang_sep_tol = cos((b->facet_separate_ang_tol - 5.0) / 180.0 * PI);
  face shloop;
  face seg1, seg2;
  REAL cosang1, cosang2;
  int i, j;

  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  while (shloop.sh != (shellface *) NULL) {
    for (i = 0; i < 3; i++) {
      if (isshsubseg(shloop)) {
        senext(shloop, neighsh);
        if (isshsubseg(neighsh)) {
          // Found two segments sharing at one vertex.
          // Check if they form a small angle.
          pa = sorg(shloop);
          pb = sdest(shloop);
          pc = sapex(shloop);
          for (j = 0; j < 3; j++) n1[j] = pa[j] - pb[j];
          for (j = 0; j < 3; j++) n2[j] = pc[j] - pb[j];
          cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
          if (cosang > cosang_tol) {
            // Found a small angle.
            segloop.sh = NULL;
            sspivot(shloop, seg1);
            sspivot(neighsh, seg2);
            if (seg1.sh[6] != NULL) {
              paryang = (REAL *) (seg1.sh[6]);
              cosang1 = *paryang;
            } else {
              cosang1 = 1.0; // 0 degree;
            }
            if (seg2.sh[6] != NULL) {
              paryang = (REAL *) (seg2.sh[6]);
              cosang2 = *paryang;
            } else {
              cosang2 = 1.0; // 0 degree;
            }
            if (cosang1 < cosang_sep_tol) {
              if (cosang2 < cosang_sep_tol) {
                if (cosang1 < cosang2) {
                  segloop = seg1;
                } else {
                  segloop = seg2;
                }
              } else {
                segloop = seg1;
              }
            } else {
              if (cosang2 < cosang_sep_tol) {
                segloop = seg2;
              }
            }
            if (segloop.sh != NULL) {
              // Remove this segment.
              segloop.shver = 0;
              spivot(segloop, parentsh);
              spivot(parentsh, neighsh);
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
              break;
            }
          }
        } // if (isshsubseg)
      } // if (isshsubseg)
      senextself(shloop);
    }
    shloop.sh = shellfacetraverse(subfaces);
  }

  delete dihedangarray;

  if (flipstack != NULL) {
    lawsonflip(); // Recover Delaunayness.
  }
}